

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O3

FunctionTypeWeakRefList * __thiscall
Js::FunctionProxy::EnsureFunctionObjectTypeList(FunctionProxy *this)

{
  Recycler *this_00;
  FunctionTypeWeakRefList *ptr;
  Recycler *alloc;
  undefined1 local_50 [8];
  TrackAllocData data;
  
  ptr = (FunctionTypeWeakRefList *)GetAuxPtr(this,FunctionObjectTypeList);
  if (ptr == (FunctionTypeWeakRefList *)0x0) {
    this_00 = this->m_scriptContext->recycler;
    local_50 = (undefined1  [8])
               &JsUtil::
                List<Memory::RecyclerWeakReference<Js::ScriptFunctionType>*,Memory::Recycler,false,Js::WeakRefFreeListedRemovePolicy,DefaultComparer>
                ::typeinfo;
    data.typeinfo = (type_info *)0x0;
    data.plusSize = 0xffffffffffffffff;
    data.count = (size_t)anon_var_dwarf_2ab02c8;
    data.filename._0_4_ = 0x877;
    alloc = Memory::Recycler::TrackAllocInfo(this_00,(TrackAllocData *)local_50);
    ptr = (FunctionTypeWeakRefList *)new<Memory::Recycler>(0x30,alloc,0x387914);
    (ptr->
    super_ReadOnlyList<Memory::RecyclerWeakReference<Js::ScriptFunctionType>_*,_Memory::Recycler,_DefaultComparer>
    ).alloc = this_00;
    (ptr->
    super_ReadOnlyList<Memory::RecyclerWeakReference<Js::ScriptFunctionType>_*,_Memory::Recycler,_DefaultComparer>
    )._vptr_ReadOnlyList = (_func_int **)&PTR_IsReadOnly_014db160;
    ptr->increment = 4;
    (ptr->removePolicy).
    super_FreeListedRemovePolicy<JsUtil::List<Memory::RecyclerWeakReference<Js::ScriptFunctionType>_*,_Memory::Recycler,_false,_Js::WeakRefFreeListedRemovePolicy,_DefaultComparer>,_true>
         = -1;
    (ptr->removePolicy).lastWeakReferenceCleanupId = this_00->weakReferenceCleanupId;
    (ptr->
    super_ReadOnlyList<Memory::RecyclerWeakReference<Js::ScriptFunctionType>_*,_Memory::Recycler,_DefaultComparer>
    ).buffer.ptr = (WriteBarrierPtr<Memory::RecyclerWeakReference<Js::ScriptFunctionType>_> *)0x0;
    (ptr->
    super_ReadOnlyList<Memory::RecyclerWeakReference<Js::ScriptFunctionType>_*,_Memory::Recycler,_DefaultComparer>
    ).count = 0;
    ptr->length = 0;
    SetAuxPtr(this,FunctionObjectTypeList,ptr);
  }
  return ptr;
}

Assistant:

FunctionProxy::FunctionTypeWeakRefList* FunctionProxy::EnsureFunctionObjectTypeList()
    {
        FunctionTypeWeakRefList* functionObjectTypeList = this->GetFunctionObjectTypeList();
        if (functionObjectTypeList == nullptr)
        {
            Recycler* recycler = this->GetScriptContext()->GetRecycler();
            functionObjectTypeList = RecyclerNew(recycler, FunctionTypeWeakRefList, recycler);
            this->SetFunctionObjectTypeList(functionObjectTypeList);
        }

        return functionObjectTypeList;
    }